

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DTDScanner.cpp
# Opt level: O0

bool __thiscall
xercesc_4_0::DTDScanner::scanEnumeration
          (DTDScanner *this,DTDAttDef *attDef,XMLBuffer *toFill,bool notation)

{
  ReaderMgr *pRVar1;
  XMLScanner *this_00;
  bool bVar2;
  int iVar3;
  XMLBuffer *pXVar4;
  undefined4 extraout_var;
  XMLCh *chars;
  XMLSize_t count;
  bool local_4d;
  bool success;
  undefined1 local_40 [8];
  XMLBufBid bbTmp;
  bool notation_local;
  XMLBuffer *toFill_local;
  DTDAttDef *attDef_local;
  DTDScanner *this_local;
  
  bbTmp.fMgr._7_1_ = notation;
  XMLBuffer::reset(toFill);
  checkForPERef(this,false,true);
  if (((bbTmp.fMgr._7_1_ & 1) != 0) &&
     (bVar2 = ReaderMgr::skippedChar(this->fReaderMgr,L'('), !bVar2)) {
    XMLScanner::emitError(this->fScanner,ExpectedOpenParen);
  }
  XMLBufBid::XMLBufBid((XMLBufBid *)local_40,this->fBufMgr);
  do {
    checkForPERef(this,false,true);
    if ((bbTmp.fMgr._7_1_ & 1) == 0) {
      pRVar1 = this->fReaderMgr;
      pXVar4 = XMLBufBid::getBuffer((XMLBufBid *)local_40);
      local_4d = ReaderMgr::getNameToken(pRVar1,pXVar4);
    }
    else {
      pRVar1 = this->fReaderMgr;
      pXVar4 = XMLBufBid::getBuffer((XMLBufBid *)local_40);
      local_4d = ReaderMgr::getName(pRVar1,pXVar4);
    }
    if (local_4d == false) {
      this_00 = this->fScanner;
      iVar3 = (*(attDef->super_XMLAttDef).super_XSerializable._vptr_XSerializable[5])();
      XMLScanner::emitError
                (this_00,ExpectedEnumValue,(XMLCh *)CONCAT44(extraout_var,iVar3),(XMLCh *)0x0,
                 (XMLCh *)0x0,(XMLCh *)0x0);
      this_local._7_1_ = false;
      goto LAB_003f3722;
    }
    chars = XMLBufBid::getRawBuffer((XMLBufBid *)local_40);
    count = XMLBufBid::getLen((XMLBufBid *)local_40);
    XMLBuffer::append(toFill,chars,count);
    checkForPERef(this,false,true);
    bVar2 = ReaderMgr::skippedChar(this->fReaderMgr,L')');
    if (bVar2) {
      this_local._7_1_ = true;
      goto LAB_003f3722;
    }
    XMLBuffer::append(toFill,L' ');
    bVar2 = ReaderMgr::skippedChar(this->fReaderMgr,L'|');
  } while (bVar2);
  XMLScanner::emitError(this->fScanner,ExpectedEnumSepOrParen);
  this_local._7_1_ = false;
LAB_003f3722:
  XMLBufBid::~XMLBufBid((XMLBufBid *)local_40);
  return this_local._7_1_;
}

Assistant:

bool DTDScanner::scanEnumeration( const   DTDAttDef&  attDef
                                    ,       XMLBuffer&  toFill
                                    , const bool        notation)
{
    // Reset the passed buffer
    toFill.reset();

    // Check for PE ref but don't require space
    checkForPERef(false, true);

    // If this is a notation, we need an opening paren
    if (notation)
    {
        if (!fReaderMgr->skippedChar(chOpenParen))
            fScanner->emitError(XMLErrs::ExpectedOpenParen);
    }

    // We need a local buffer to use as well
    XMLBufBid bbTmp(fBufMgr);

    while (true)
    {
        // Space is allowed here for either type so check for PE ref
        checkForPERef(false, true);

        // And then get either a name or a name token
        bool success;
        if (notation)
            success = fReaderMgr->getName(bbTmp.getBuffer());
        else
            success = fReaderMgr->getNameToken(bbTmp.getBuffer());

        if (!success)
        {
            fScanner->emitError
            (
                XMLErrs::ExpectedEnumValue
                , attDef.getFullName()
            );
            return false;
        }

        // Append this value to the target value
        toFill.append(bbTmp.getRawBuffer(), bbTmp.getLen());

        // Space is allowed here for either type so check for PE ref
        checkForPERef(false, true);

        // Check for the terminating paren
        if (fReaderMgr->skippedChar(chCloseParen))
            break;

        // And append a space separator
        toFill.append(chSpace);

        // Check for the pipe character separator
        if (!fReaderMgr->skippedChar(chPipe))
        {
            fScanner->emitError(XMLErrs::ExpectedEnumSepOrParen);
            return false;
        }
    }
    return true;
}